

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableType.cpp
# Opt level: O2

VariableType * rsg::VariableType::getScalarType(Type baseType)

{
  int iVar1;
  Exception *this;
  VariableType *pVVar2;
  VariableType *pVVar3;
  code *pcVar4;
  undefined1 *puVar5;
  allocator<char> local_39;
  string local_38;
  
  switch(baseType) {
  case TYPE_FLOAT:
    if (getScalarType(rsg::VariableType::Type)::s_floatTypes != '\0') {
      return getScalarType::s_floatTypes;
    }
    puVar5 = &getScalarType(rsg::VariableType::Type)::s_floatTypes;
    iVar1 = __cxa_guard_acquire(&getScalarType(rsg::VariableType::Type)::s_floatTypes);
    if (iVar1 == 0) {
      return getScalarType::s_floatTypes;
    }
    getScalarType::s_floatTypes[0].m_baseType = TYPE_FLOAT;
    getScalarType::s_floatTypes[0].m_precision = PRECISION_NONE;
    pVVar2 = getScalarType::s_floatTypes;
    getScalarType::s_floatTypes[0].m_typeName._M_dataplus._M_p =
         (pointer)&getScalarType::s_floatTypes[0].m_typeName.field_2;
    getScalarType::s_floatTypes[0].m_typeName._M_string_length = 0;
    getScalarType::s_floatTypes[0].m_typeName.field_2._M_local_buf[0] = '\0';
    getScalarType::s_floatTypes[0].m_numElements = 1;
    getScalarType::s_floatTypes[0].m_elementType = (VariableType *)0x0;
    getScalarType::s_floatTypes[0].m_members.
    super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    getScalarType::s_floatTypes[0].m_members.
    super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    getScalarType::s_floatTypes[0].m_members.
    super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pcVar4 = __cxx_global_array_dtor;
    break;
  case TYPE_INT:
    if (getScalarType(rsg::VariableType::Type)::s_intTypes != '\0') {
      return getScalarType::s_intTypes;
    }
    puVar5 = &getScalarType(rsg::VariableType::Type)::s_intTypes;
    iVar1 = __cxa_guard_acquire(&getScalarType(rsg::VariableType::Type)::s_intTypes);
    if (iVar1 == 0) {
      return getScalarType::s_intTypes;
    }
    getScalarType::s_intTypes[0].m_baseType = TYPE_INT;
    getScalarType::s_intTypes[0].m_precision = PRECISION_NONE;
    pVVar2 = getScalarType::s_intTypes;
    getScalarType::s_intTypes[0].m_typeName._M_dataplus._M_p =
         (pointer)&getScalarType::s_intTypes[0].m_typeName.field_2;
    getScalarType::s_intTypes[0].m_typeName._M_string_length = 0;
    getScalarType::s_intTypes[0].m_typeName.field_2._M_local_buf[0] = '\0';
    getScalarType::s_intTypes[0].m_numElements = 1;
    getScalarType::s_intTypes[0].m_elementType = (VariableType *)0x0;
    getScalarType::s_intTypes[0].m_members.
    super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    getScalarType::s_intTypes[0].m_members.
    super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    getScalarType::s_intTypes[0].m_members.
    super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pcVar4 = __cxx_global_array_dtor_1;
    break;
  case TYPE_BOOL:
    if (getScalarType(rsg::VariableType::Type)::s_boolTypes != '\0') {
      return getScalarType::s_boolTypes;
    }
    puVar5 = &getScalarType(rsg::VariableType::Type)::s_boolTypes;
    iVar1 = __cxa_guard_acquire(&getScalarType(rsg::VariableType::Type)::s_boolTypes);
    if (iVar1 == 0) {
      return getScalarType::s_boolTypes;
    }
    getScalarType::s_boolTypes[0].m_baseType = TYPE_BOOL;
    getScalarType::s_boolTypes[0].m_precision = PRECISION_NONE;
    pVVar2 = getScalarType::s_boolTypes;
    getScalarType::s_boolTypes[0].m_typeName._M_dataplus._M_p =
         (pointer)&getScalarType::s_boolTypes[0].m_typeName.field_2;
    getScalarType::s_boolTypes[0].m_typeName._M_string_length = 0;
    getScalarType::s_boolTypes[0].m_typeName.field_2._M_local_buf[0] = '\0';
    getScalarType::s_boolTypes[0].m_numElements = 1;
    getScalarType::s_boolTypes[0].m_elementType = (VariableType *)0x0;
    getScalarType::s_boolTypes[0].m_members.
    super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    getScalarType::s_boolTypes[0].m_members.
    super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    getScalarType::s_boolTypes[0].m_members.
    super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pcVar4 = __cxx_global_array_dtor_2;
    break;
  default:
    this = (Exception *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"VariableType::getScalarType(): unsupported type",&local_39);
    Exception::Exception(this,&local_38);
    __cxa_throw(this,&Exception::typeinfo,std::runtime_error::~runtime_error);
  case TYPE_SAMPLER_2D:
    if (getScalarType(rsg::VariableType::Type)::sampler2DType != '\0') {
      return &getScalarType::sampler2DType;
    }
    puVar5 = &getScalarType(rsg::VariableType::Type)::sampler2DType;
    iVar1 = __cxa_guard_acquire(&getScalarType(rsg::VariableType::Type)::sampler2DType);
    if (iVar1 == 0) {
      return &getScalarType::sampler2DType;
    }
    getScalarType::sampler2DType.m_baseType = TYPE_SAMPLER_2D;
    getScalarType::sampler2DType.m_precision = PRECISION_NONE;
    pVVar2 = &getScalarType::sampler2DType;
    getScalarType::sampler2DType.m_typeName._M_dataplus._M_p =
         (pointer)&getScalarType::sampler2DType.m_typeName.field_2;
    getScalarType::sampler2DType.m_typeName._M_string_length = 0;
    getScalarType::sampler2DType.m_typeName.field_2._M_local_buf[0] = '\0';
    getScalarType::sampler2DType.m_numElements = 1;
    getScalarType::sampler2DType.m_elementType = (VariableType *)0x0;
    getScalarType::sampler2DType.m_members.
    super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    getScalarType::sampler2DType.m_members.
    super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    getScalarType::sampler2DType.m_members.
    super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    goto LAB_0093e5d4;
  case TYPE_SAMPLER_CUBE:
    if (getScalarType(rsg::VariableType::Type)::samplerCubeType != '\0') {
      return &getScalarType::samplerCubeType;
    }
    puVar5 = &getScalarType(rsg::VariableType::Type)::samplerCubeType;
    iVar1 = __cxa_guard_acquire(&getScalarType(rsg::VariableType::Type)::samplerCubeType);
    if (iVar1 == 0) {
      return &getScalarType::samplerCubeType;
    }
    getScalarType::samplerCubeType.m_baseType = TYPE_SAMPLER_CUBE;
    getScalarType::samplerCubeType.m_precision = PRECISION_NONE;
    pVVar2 = &getScalarType::samplerCubeType;
    getScalarType::samplerCubeType.m_typeName._M_dataplus._M_p =
         (pointer)&getScalarType::samplerCubeType.m_typeName.field_2;
    getScalarType::samplerCubeType.m_typeName._M_string_length = 0;
    getScalarType::samplerCubeType.m_typeName.field_2._M_local_buf[0] = '\0';
    getScalarType::samplerCubeType.m_numElements = 1;
    getScalarType::samplerCubeType.m_elementType = (VariableType *)0x0;
    getScalarType::samplerCubeType.m_members.
    super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    getScalarType::samplerCubeType.m_members.
    super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    getScalarType::samplerCubeType.m_members.
    super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
LAB_0093e5d4:
    pcVar4 = ~VariableType;
    pVVar3 = pVVar2;
    goto LAB_0093e674;
  }
  pVVar3 = (VariableType *)0x0;
LAB_0093e674:
  __cxa_atexit(pcVar4,pVVar3,&__dso_handle);
  __cxa_guard_release(puVar5);
  return pVVar2;
}

Assistant:

const VariableType& VariableType::getScalarType (Type baseType)
{
	switch (baseType)
	{
		case TYPE_FLOAT:
		{
			static const VariableType s_floatTypes[] =
			{
				VariableType(TYPE_FLOAT, 1)
				// \todo [pyry] Extend with different precision variants?
			};
			return s_floatTypes[0];
		}

		case TYPE_INT:
		{
			static const VariableType s_intTypes[] =
			{
				VariableType(TYPE_INT, 1)
			};
			return s_intTypes[0];
		}

		case TYPE_BOOL:
		{
			static const VariableType s_boolTypes[] =
			{
				VariableType(TYPE_BOOL, 1)
			};
			return s_boolTypes[0];
		}

		case TYPE_SAMPLER_2D:
		{
			static const VariableType sampler2DType = VariableType(TYPE_SAMPLER_2D, 1);
			return sampler2DType;
		}

		case TYPE_SAMPLER_CUBE:
		{
			static const VariableType samplerCubeType = VariableType(TYPE_SAMPLER_CUBE, 1);
			return samplerCubeType;
		}

		default:
			DE_ASSERT(DE_FALSE);
			throw Exception("VariableType::getScalarType(): unsupported type");
	}
}